

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O2

Vec2 vkt::texture::util::calcLevelLodBounds(Vec2 *lodBounds,int level)

{
  float fVar1;
  Vec2 VVar2;
  Vec2 *levelLodBounds;
  uint *in_RDI;
  uint uVar3;
  float fVar4;
  float in_XMM0_Db;
  
  fVar4 = (float)level;
  fVar1 = lodBounds->m_data[0];
  *in_RDI = ~-(uint)(0.0 < fVar1) & (uint)fVar1 |
            (~-(uint)(fVar4 <= fVar1) & (uint)fVar4 | -(uint)(fVar4 <= fVar1) & (uint)fVar1) &
            -(uint)(0.0 < fVar1);
  fVar4 = fVar4 + 1.0;
  uVar3 = -(uint)(lodBounds->m_data[1] <= fVar4);
  in_RDI[1] = ~uVar3 & (uint)fVar4 | (uint)lodBounds->m_data[1] & uVar3;
  VVar2.m_data[1] = in_XMM0_Db;
  VVar2.m_data[0] = fVar4;
  return (Vec2)VVar2.m_data;
}

Assistant:

Vec2 calcLevelLodBounds (const Vec2& lodBounds, int level)
{
	Vec2 levelLodBounds;

	if (lodBounds[0] <= 0.0f)
	{
		levelLodBounds[0] = lodBounds[0];
	}
	else
	{
		levelLodBounds[0] = de::max(lodBounds[0], (float) level);
	}

	levelLodBounds[1] = de::min(lodBounds[1], (float) level + 1.0f);

	return levelLodBounds;
}